

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catridge.h
# Opt level: O2

bool __thiscall Catridge::ppuRead(Catridge *this,uint16_t addr,uint8_t *data)

{
  int iVar1;
  uint32_t mappedAddr;
  
  iVar1 = (*((this->pMapper).super___shared_ptr<Mapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_Mapper[2])();
  if (SUB41(iVar1,0) != false) {
    *data = *(this->vCHRMemory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  return SUB41(iVar1,0);
}

Assistant:

bool ppuRead(uint16_t addr, uint8_t &data) const
  {
    uint32_t mappedAddr = 0;
    if (pMapper->ppuMapRead(addr, mappedAddr))
    {
      data = vCHRMemory[mappedAddr];
      return true;
    }
    return false;
  }